

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::DescriptorScriptPubKeyMan::SetCache(DescriptorScriptPubKeyMan *this,DescriptorCache *cache)

{
  __normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_> __first;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  runtime_error *prVar4;
  char *fmt;
  mapped_type_conflict *args;
  long in_RDI;
  long in_FS_OFFSET;
  CPubKey *pubkey;
  pair<const_CKeyID,_CPubKey> *pk_pair;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *__range2_1;
  CScript *script;
  vector<CScript,_std::allocator<CScript>_> *__range2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  int32_t i;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock72;
  FlatSigningProvider out_keys;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> new_spks;
  FlatSigningProvider *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  DescriptorCache *in_stack_fffffffffffffd98;
  __normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
  in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdac;
  map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
  *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffdc0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffdc8;
  undefined1 local_180 [28];
  uint local_164;
  string local_150 [32];
  undefined1 local_130 [248];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
             SUB41((uint)in_stack_fffffffffffffda8 >> 0x18,0));
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::set
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)in_stack_fffffffffffffd88
            );
  DescriptorCache::operator=
            (in_stack_fffffffffffffd98,
             (DescriptorCache *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  local_164 = *(uint *)(in_RDI + 0x198);
  do {
    if (*(int *)(in_RDI + 0x19c) <= (int)local_164) {
      (**(code **)(**(long **)(in_RDI + 8) + 0x58))(*(long **)(in_RDI + 8),local_38);
      std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::~set
                ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                 in_stack_fffffffffffffd88);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_00407f46:
      __stack_chk_fail();
    }
    FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffd88);
    std::vector<CScript,_std::allocator<CScript>_>::vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffd88);
    peVar3 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )in_stack_fffffffffffffd88);
    uVar2 = (*peVar3->_vptr_Descriptor[9])
                      (peVar3,(ulong)local_164,in_RDI + 0x1a8,local_180,local_130);
    if ((uVar2 & 1) == 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Error: Unable to expand wallet descriptor from cache");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00407f46;
    }
    std::vector<CScript,_std::allocator<CScript>_>::begin
              ((vector<CScript,_std::allocator<CScript>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::vector<CScript,_std::allocator<CScript>_>::end
              ((vector<CScript,_std::allocator<CScript>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    __first._M_current._4_4_ = in_stack_fffffffffffffdac;
    __first._M_current._0_4_ = in_stack_fffffffffffffda8;
    std::set<CScript,std::less<CScript>,std::allocator<CScript>>::
    insert<__gnu_cxx::__normal_iterator<CScript*,std::vector<CScript,std::allocator<CScript>>>>
              ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
               in_stack_fffffffffffffd88,__first,in_stack_fffffffffffffda0);
    std::vector<CScript,_std::allocator<CScript>_>::begin
              ((vector<CScript,_std::allocator<CScript>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::vector<CScript,_std::allocator<CScript>_>::end
              ((vector<CScript,_std::allocator<CScript>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    while (bVar1 = __gnu_cxx::operator==<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                             ((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                               *)in_stack_fffffffffffffd98,
                              (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>::
      operator*((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_> *)
                in_stack_fffffffffffffd88);
      fmt = (char *)std::
                    map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                    ::count((map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                             *)in_stack_fffffffffffffd98,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      if (fmt != (char *)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        args = std::
               map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
               ::operator[](in_stack_fffffffffffffdb0,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        tinyformat::format<int,int>(fmt,args,(int *)prVar4);
        std::runtime_error::runtime_error(prVar4,local_150);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00407f46;
      }
      in_stack_fffffffffffffdac = local_164;
      in_stack_fffffffffffffdb0 =
           (map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_> *
           )std::
            map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>::
            operator[](in_stack_fffffffffffffdb0,
                       (key_type *)CONCAT44(local_164,in_stack_fffffffffffffda8));
      *(uint *)&(in_stack_fffffffffffffdb0->_M_t)._M_impl = in_stack_fffffffffffffdac;
      __gnu_cxx::__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>::
      operator++((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_> *)
                 in_stack_fffffffffffffd88);
    }
    std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
           *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd98,
                                   (_Self *)CONCAT44(in_stack_fffffffffffffd94,
                                                     in_stack_fffffffffffffd90)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator*
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffda0._M_current =
           (CScript *)
           std::
           map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>::
           count((map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                  *)in_stack_fffffffffffffd98,
                 (key_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      if (in_stack_fffffffffffffda0._M_current == (CScript *)0x0) {
        in_stack_fffffffffffffd94 = local_164;
        in_stack_fffffffffffffd98 =
             (DescriptorCache *)
             std::
             map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
             ::operator[]((map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                           *)in_stack_fffffffffffffdb0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
        ;
        *(uint *)&(in_stack_fffffffffffffd98->m_derived_xpubs)._M_h._M_buckets =
             in_stack_fffffffffffffd94;
      }
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)in_stack_fffffffffffffd88);
    }
    *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffd98);
    FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffd88);
    local_164 = local_164 + 1;
  } while( true );
}

Assistant:

void DescriptorScriptPubKeyMan::SetCache(const DescriptorCache& cache)
{
    LOCK(cs_desc_man);
    std::set<CScript> new_spks;
    m_wallet_descriptor.cache = cache;
    for (int32_t i = m_wallet_descriptor.range_start; i < m_wallet_descriptor.range_end; ++i) {
        FlatSigningProvider out_keys;
        std::vector<CScript> scripts_temp;
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(i, m_wallet_descriptor.cache, scripts_temp, out_keys)) {
            throw std::runtime_error("Error: Unable to expand wallet descriptor from cache");
        }
        // Add all of the scriptPubKeys to the scriptPubKey set
        new_spks.insert(scripts_temp.begin(), scripts_temp.end());
        for (const CScript& script : scripts_temp) {
            if (m_map_script_pub_keys.count(script) != 0) {
                throw std::runtime_error(strprintf("Error: Already loaded script at index %d as being at index %d", i, m_map_script_pub_keys[script]));
            }
            m_map_script_pub_keys[script] = i;
        }
        for (const auto& pk_pair : out_keys.pubkeys) {
            const CPubKey& pubkey = pk_pair.second;
            if (m_map_pubkeys.count(pubkey) != 0) {
                // We don't need to give an error here.
                // It doesn't matter which of many valid indexes the pubkey has, we just need an index where we can derive it and it's private key
                continue;
            }
            m_map_pubkeys[pubkey] = i;
        }
        m_max_cached_index++;
    }
    // Make sure the wallet knows about our new spks
    m_storage.TopUpCallback(new_spks, this);
}